

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void delay_set_areg(DisasContext_conflict2 *s,uint regno,TCGv_i32 val,_Bool give_temp)

{
  TCGContext_conflict2 *s_00;
  TCGv_i32 pTVar1;
  TCGTemp *a1;
  uintptr_t o_2;
  
  s_00 = s->uc->tcg_ctx;
  if (((uint)s->writeback_mask >> (regno & 0x1f) & 1) == 0) {
    s->writeback_mask = s->writeback_mask | 1 << ((byte)regno & 0x1f);
    if (give_temp) {
      s->writeback[regno] = val;
    }
    else {
      a1 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
      s->writeback[regno] = (TCGv_i32)((long)a1 - (long)s_00);
      if ((TCGv_i32)((long)a1 - (long)s_00) != val) goto LAB_0070184c;
    }
  }
  else {
    pTVar1 = s->writeback[regno];
    if (give_temp) {
      tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(pTVar1 + (long)s_00));
      s->writeback[regno] = val;
    }
    else if (pTVar1 != val) {
      a1 = (TCGTemp *)(pTVar1 + (long)s_00);
LAB_0070184c:
      tcg_gen_op2_m68k(s_00,INDEX_op_mov_i32,(TCGArg)a1,(TCGArg)(val + (long)s_00));
      return;
    }
  }
  return;
}

Assistant:

static void delay_set_areg(DisasContext *s, unsigned regno,
                           TCGv val, bool give_temp)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    if (s->writeback_mask & (1 << regno)) {
        if (give_temp) {
            tcg_temp_free(tcg_ctx, s->writeback[regno]);
            s->writeback[regno] = val;
        } else {
            tcg_gen_mov_i32(tcg_ctx, s->writeback[regno], val);
        }
    } else {
        s->writeback_mask |= 1 << regno;
        if (give_temp) {
            s->writeback[regno] = val;
        } else {
            TCGv tmp = tcg_temp_new(tcg_ctx);
            s->writeback[regno] = tmp;
            tcg_gen_mov_i32(tcg_ctx, tmp, val);
        }
    }
}